

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_stream_amend.c
# Opt level: O2

RK_S32 get_next_nal(RK_U8 *buf,RK_S32 *length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = *length;
  uVar2 = uVar1;
  while (3 < (int)uVar2) {
    if (buf[2] == 0) {
      uVar2 = uVar2 - 1;
      buf = buf + 1;
    }
    else {
      if (((*buf != 0) || (buf[2] != 1)) || (buf[1] != 0)) {
        uVar3 = 0xffffffff;
        uVar4 = (ulong)uVar2;
        goto LAB_0023690d;
      }
      buf = buf + 3;
      uVar2 = uVar2 - 3;
    }
  }
  uVar2 = 0;
LAB_00236942:
  *length = uVar1 - uVar2;
  return uVar2;
LAB_0023690d:
  uVar2 = uVar1;
  if (uVar4 == 0) goto LAB_00236942;
  if ((uVar3 & 0xffffff) == 1) {
    uVar2 = (uVar1 - (int)uVar4) - 4;
    goto LAB_00236942;
  }
  uVar3 = uVar3 << 8 | (uint)*buf;
  buf = buf + 1;
  uVar4 = uVar4 - 1;
  goto LAB_0023690d;
}

Assistant:

static RK_S32 get_next_nal(RK_U8 *buf, RK_S32 *length)
{
    RK_S32 i, consumed = 0;
    RK_S32 len = *length;
    RK_U8 *tmp_buf = buf;

    /* search start code */
    while (len >= 4) {
        if (tmp_buf[2] == 0) {
            len--;
            tmp_buf++;
            continue;
        }

        if (tmp_buf[0] != 0 || tmp_buf[1] != 0 || tmp_buf[2] != 1) {
            RK_U32 state = (RK_U32) - 1;
            RK_S32 has_nal = 0;

            for (i = 0; i < (RK_S32)len; i++) {
                state = (state << 8) | tmp_buf[i];
                if (((state >> 8) & 0xFFFFFF) == START_CODE) {
                    has_nal = 1;
                    i = i - 3;
                    break;
                }
            }

            if (has_nal) {
                len -= i;
                tmp_buf += i;
                consumed = *length - len - 1;
                break;
            }

            consumed = *length;
            break;
        }
        tmp_buf   += 3;
        len       -= 3;
    }

    *length = *length - consumed;
    return consumed;
}